

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodemb_test.cc
# Opt level: O2

void __thiscall
anon_unknown.dwarf_1884927::DropoutTest_NumBeforeLargerThanNumAfter_Test::TestBody
          (DropoutTest_NumBeforeLargerThanNumAfter_Test *this)

{
  int in_ECX;
  tran_low_t *in_R8;
  initializer_list<int> __l;
  allocator_type local_131;
  _Vector_base<int,_std::allocator<int>_> local_130;
  int local_118 [32];
  tran_low_t qcoeff_scan [32];
  
  qcoeff_scan[6] = 0;
  qcoeff_scan[7] = 0;
  qcoeff_scan[10] = 0;
  qcoeff_scan[0xb] = 0;
  qcoeff_scan[0x1c] = 0;
  qcoeff_scan[0x1d] = 0;
  qcoeff_scan[0x1e] = 0;
  qcoeff_scan[0x1f] = 0;
  qcoeff_scan[0x18] = 0;
  qcoeff_scan[0x19] = 0;
  qcoeff_scan[0x1a] = 0;
  qcoeff_scan[0x1b] = 0;
  qcoeff_scan[0x14] = 0;
  qcoeff_scan[0x15] = 0;
  qcoeff_scan[0x16] = 0;
  qcoeff_scan[0x17] = 0;
  qcoeff_scan[0x10] = 0;
  qcoeff_scan[0x11] = 0;
  qcoeff_scan[0x12] = 0;
  qcoeff_scan[0x13] = 0;
  qcoeff_scan[0xc] = 0;
  qcoeff_scan[0xd] = 0;
  qcoeff_scan[0xe] = 0;
  qcoeff_scan[0xf] = 0;
  qcoeff_scan[0] = 0;
  qcoeff_scan[1] = 0;
  qcoeff_scan[2] = 0;
  qcoeff_scan[3] = 0;
  qcoeff_scan[4] = 1;
  qcoeff_scan[5] = 0;
  qcoeff_scan[8] = -2;
  qcoeff_scan[9] = 0;
  Dropout('\x06','\x02',(int)qcoeff_scan,in_ECX,in_R8);
  local_118[0x1c] = 0;
  local_118[0x1d] = 0;
  local_118[0x1e] = 0;
  local_118[0x1f] = 0;
  local_118[0x18] = 0;
  local_118[0x19] = 0;
  local_118[0x1a] = 0;
  local_118[0x1b] = 0;
  local_118[0x14] = 0;
  local_118[0x15] = 0;
  local_118[0x16] = 0;
  local_118[0x17] = 0;
  local_118[0x10] = 0;
  local_118[0x11] = 0;
  local_118[0x12] = 0;
  local_118[0x13] = 0;
  local_118[0xc] = 0;
  local_118[0xd] = 0;
  local_118[0xe] = 0;
  local_118[0xf] = 0;
  local_118[8] = 0;
  local_118[9] = 0;
  local_118[10] = 0;
  local_118[0xb] = 0;
  local_118[4] = 0;
  local_118[5] = 0;
  local_118[6] = 0;
  local_118[7] = 0;
  local_118[0] = 0;
  local_118[1] = 0;
  local_118[2] = 0;
  local_118[3] = 0;
  __l._M_len = 0x20;
  __l._M_array = local_118;
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&local_130,__l,&local_131);
  ExpectArrayEq(qcoeff_scan,(vector<int,_std::allocator<int>_> *)&local_130);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_130);
  return;
}

Assistant:

TEST(DropoutTest, NumBeforeLargerThanNumAfter) {
  const TX_SIZE tx_size = TX_8X4;
  const uint32_t dropout_num_before = 4;
  const uint32_t dropout_num_after = 2;
  // The second coeff (-2) doesn't seem to meet the dropout_num_before
  // criteria. But since the first coeff (1) will be dropped, it will meet
  // the criteria and should be dropped too.
  tran_low_t qcoeff_scan[] = { 0,  0, 0, 0, 1, 0, 0, 0,  // should be removed
                               -2, 0, 0, 0, 0, 0, 0, 0,  // should be removed
                               0,  0, 0, 0, 0, 0, 0, 0,  //
                               0,  0, 0, 0, 0, 0, 0, 0 };
  Dropout(tx_size, kTxType, dropout_num_before, dropout_num_after, qcoeff_scan);
  ExpectArrayEq(qcoeff_scan, { 0, 0, 0, 0, 0, 0, 0, 0,  //
                               0, 0, 0, 0, 0, 0, 0, 0,  //
                               0, 0, 0, 0, 0, 0, 0, 0,  //
                               0, 0, 0, 0, 0, 0, 0, 0 });
}